

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O1

void __thiscall
Assimp::DXFImporter::ParseInsertion(DXFImporter *this,LineReader *reader,FileData *output)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  pointer pIVar3;
  bool check_comma;
  ulong in_RCX;
  InsertBlock local_70;
  
  paVar1 = &local_70.name.field_2;
  local_70.pos.x = 0.0;
  local_70.pos.y = 0.0;
  local_70.pos.z = 0.0;
  local_70.scale.x = 1.0;
  local_70.scale.y = 1.0;
  local_70.scale.z = 1.0;
  local_70.angle = 0.0;
  local_70.name._M_string_length = 0;
  local_70.name.field_2._M_local_buf[0] = '\0';
  local_70.name._M_dataplus._M_p = (pointer)paVar1;
  std::vector<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>::
  emplace_back<Assimp::DXF::InsertBlock>
            (&(output->blocks).
              super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].insertions,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.name._M_dataplus._M_p,
                    CONCAT71(local_70.name.field_2._M_allocated_capacity._1_7_,
                             local_70.name.field_2._M_local_buf[0]) + 1);
  }
  if (reader->end < 2) {
    pIVar3 = (output->blocks).
             super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].insertions.
             super__Vector_base<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      iVar2 = reader->groupcode;
      if (iVar2 < 0x14) {
        if (iVar2 == 2) {
          std::__cxx11::string::_M_assign((string *)&pIVar3[-1].name);
        }
        else if (iVar2 == 10) {
          local_70.pos._0_8_ = local_70.pos._0_8_ & 0xffffffff00000000;
          fast_atoreal_move<float>
                    ((Assimp *)(reader->value)._M_dataplus._M_p,(char *)&local_70,(float *)0x1,
                     SUB81(in_RCX,0));
          pIVar3[-1].pos.x = local_70.pos.x;
        }
        else if (iVar2 == 0) {
          return;
        }
      }
      else {
        in_RCX = (ulong)(iVar2 - 0x29U);
        check_comma = SUB41(iVar2 - 0x29U,0);
        switch(in_RCX) {
        case 0:
          local_70.pos._0_8_ = (ulong)(uint)local_70.pos.y << 0x20;
          fast_atoreal_move<float>
                    ((Assimp *)(reader->value)._M_dataplus._M_p,(char *)&local_70,(float *)0x1,
                     check_comma);
          pIVar3[-1].scale.x = local_70.pos.x;
          break;
        case 1:
          local_70.pos._0_8_ = (ulong)(uint)local_70.pos.y << 0x20;
          fast_atoreal_move<float>
                    ((Assimp *)(reader->value)._M_dataplus._M_p,(char *)&local_70,(float *)0x1,
                     check_comma);
          pIVar3[-1].scale.y = local_70.pos.x;
          break;
        case 2:
          local_70.pos._0_8_ = (ulong)(uint)local_70.pos.y << 0x20;
          fast_atoreal_move<float>
                    ((Assimp *)(reader->value)._M_dataplus._M_p,(char *)&local_70,(float *)0x1,
                     check_comma);
          pIVar3[-1].scale.z = local_70.pos.x;
          break;
        case 3:
        case 4:
        case 5:
        case 6:
        case 7:
        case 8:
          break;
        case 9:
          local_70.pos._0_8_ = (ulong)(uint)local_70.pos.y << 0x20;
          fast_atoreal_move<float>
                    ((Assimp *)(reader->value)._M_dataplus._M_p,(char *)&local_70,(float *)0x1,
                     check_comma);
          pIVar3[-1].angle = local_70.pos.x;
          break;
        default:
          if (iVar2 == 0x14) {
            local_70.pos._0_8_ = (ulong)(uint)local_70.pos.y << 0x20;
            fast_atoreal_move<float>
                      ((Assimp *)(reader->value)._M_dataplus._M_p,(char *)&local_70,(float *)0x1,
                       check_comma);
            pIVar3[-1].pos.y = local_70.pos.x;
          }
          else if (iVar2 == 0x1e) {
            local_70.pos._0_8_ = (ulong)(uint)local_70.pos.y << 0x20;
            fast_atoreal_move<float>
                      ((Assimp *)(reader->value)._M_dataplus._M_p,(char *)&local_70,(float *)0x1,
                       check_comma);
            pIVar3[-1].pos.z = local_70.pos.x;
          }
        }
      }
      DXF::LineReader::operator++(reader);
    } while (reader->end < 2);
  }
  return;
}

Assistant:

void DXFImporter::ParseInsertion(DXF::LineReader& reader, DXF::FileData& output) {
    output.blocks.back().insertions.push_back( DXF::InsertBlock() );
    DXF::InsertBlock& bl = output.blocks.back().insertions.back();

    while( !reader.End() && !reader.Is(0)) {
        switch(reader.GroupCode()) {
            // name of referenced block
        case GroupCode_Name:
            bl.name = reader.Value();
            break;

            // translation
        case GroupCode_XComp:
            bl.pos.x = reader.ValueAsFloat();
            break;
        case GroupCode_YComp:
            bl.pos.y = reader.ValueAsFloat();
            break;
        case GroupCode_ZComp:
            bl.pos.z = reader.ValueAsFloat();
            break;

            // scaling
        case 41:
            bl.scale.x = reader.ValueAsFloat();
            break;
        case 42:
            bl.scale.y = reader.ValueAsFloat();
            break;
        case 43:
            bl.scale.z = reader.ValueAsFloat();
            break;

            // rotation angle
        case 50:
            bl.angle = reader.ValueAsFloat();
            break;
        }
        reader++;
    }
}